

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

char * jx9ExtractDirName(char *zPath,int nByte,int *pLen)

{
  bool bVar1;
  int d;
  int c;
  char *zEnd;
  int *pLen_local;
  int nByte_local;
  char *zPath_local;
  
  _d = zPath + (nByte + -1);
  while( true ) {
    bVar1 = false;
    if ((zPath < _d) && (bVar1 = false, *_d != '/')) {
      bVar1 = *_d != '/';
    }
    if (!bVar1) break;
    _d = _d + -1;
  }
  *pLen = (int)_d - (int)zPath;
  if (((_d == zPath) && (*_d != '/')) && (*_d != '/')) {
    *pLen = 1;
    zPath_local = ".";
  }
  else {
    zPath_local = zPath;
    if (*pLen == 0) {
      *pLen = 1;
      zPath_local = "/";
    }
  }
  return zPath_local;
}

Assistant:

JX9_PRIVATE const char * jx9ExtractDirName(const char *zPath, int nByte, int *pLen)
{
	const char *zEnd = &zPath[nByte - 1];
	int c, d;
	c = d = '/';
#ifdef __WINNT__
	d = '\\';
#endif
	while( zEnd > zPath && ( (int)zEnd[0] != c && (int)zEnd[0] != d ) ){
		zEnd--;
	}
	*pLen = (int)(zEnd-zPath);
#ifdef __WINNT__
	if( (*pLen) == (int)sizeof(char) && zPath[0] == '/' ){
		/* Normalize path on windows */
		return "\\";
	}
#endif
	if( zEnd == zPath && ( (int)zEnd[0] != c && (int)zEnd[0] != d) ){
		/* No separator, return "." as the current directory */
		*pLen = sizeof(char);
		return ".";
	}
	if( (*pLen) == 0 ){
		*pLen = sizeof(char);
#ifdef __WINNT__
		return "\\";
#else
		return "/";
#endif
	}
	return zPath;
}